

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void apply_to_each(dill_stream c,void *insns,virtual_mach_info vmi,apply_func func)

{
  basic_block_conflict pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < (ulong)(long)vmi->bbcount; uVar3 = uVar3 + 1) {
    pbVar1 = vmi->bblist + uVar3;
    for (uVar2 = vmi->bblist[uVar3].start; uVar2 <= (ulong)pbVar1->end; uVar2 = uVar2 + 1) {
      (*func)(c,pbVar1,(virtual_insn *)insns,(int)uVar2);
    }
  }
  return;
}

Assistant:

static void
apply_to_each(dill_stream c,
              void* insns,
              virtual_mach_info vmi,
              apply_func func)
{
    size_t i, j = 0;

    for (i = 0; i < vmi->bbcount; i++) {
        basic_block bb = &vmi->bblist[i];
        for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
            (func)(c, bb, insns, (int)j);
        }
    }
}